

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::query_abi_cxx11_
          (string *__return_storage_ptr__,CommonCore *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  atomic<int> *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  future_status fVar6;
  FederateState *fed;
  ulong extraout_RAX;
  string *val;
  long *__s;
  size_t __len2;
  action_t aVar7;
  size_t size;
  byte *__src;
  size_type __rlen_2;
  size_type __rlen;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult;
  json base;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_1;
  ActionMessage querycmd;
  _Any_data local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  string local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [32];
  undefined1 local_e8 [64];
  SmallBuffer local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __src = (byte *)queryStr._M_str;
  size = queryStr._M_len;
  __s = (long *)target._M_str;
  __len2 = target._M_len;
  if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
    aVar7 = cmd_query_ordered;
    if (mode == HELICS_SEQUENCING_MODE_FAST) {
      aVar7 = cmd_query;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar7);
    local_e8._8_4_ = -0x396fe;
    local_e8._16_4_ = 0;
    local_a8.bufferSize = size;
    if ((local_a8.heap != __src) && (SmallBuffer::reserve(&local_a8,size), size != 0)) {
      memcpy(local_a8.heap,__src,size);
    }
    LOCK();
    paVar1 = &this->queryCounter;
    iVar4 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar4 = iVar4 + 1;
    local_e8._4_4_ = iVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_48,1);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0,
               (size_type)
               (local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,(char *)__s,__len2);
    if (__len2 == 4) {
      if ((int)*__s == 0x65726f63) {
LAB_002f8c34:
        quickCoreQueries_abi_cxx11_(__return_storage_ptr__,this,queryStr);
        if (__return_storage_ptr__->_M_string_length != 0) goto LAB_002f8d6a;
        if ((size == 7) &&
           (*(undefined4 *)(__src + 3) == 0x73736572 && *(undefined4 *)__src == 0x72646461)) {
          val = getAddress_abi_cxx11_(this);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)&local_168,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_138,-1,' ',true,hex);
          query_abi_cxx11_();
          goto LAB_002f8d6a;
        }
        aVar7 = cmd_broker_query_ordered;
        if (mode == HELICS_SEQUENCING_MODE_FAST) {
          aVar7 = cmd_broker_query;
        }
        ActionMessage::setAction((ActionMessage *)local_e8,aVar7);
        local_e8._16_4_ = -0x396fe;
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == &__return_storage_ptr__->field_2) goto LAB_002f8d13;
        operator_delete(pcVar2,(__return_storage_ptr__->field_2)._M_allocated_capacity + 1);
        goto LAB_002f8cbf;
      }
      if ((this->super_BrokerBase).identifier._M_string_length == 4) {
LAB_002f8bae:
        iVar5 = bcmp(__s,(this->super_BrokerBase).identifier._M_dataplus._M_p,__len2);
        if (iVar5 != 0) goto LAB_002f8cbf;
        goto LAB_002f8c34;
      }
      if (local_e8._16_4_ != -0x396fe) goto LAB_002f8ce5;
    }
    else {
      if ((this->super_BrokerBase).identifier._M_string_length == __len2) {
        if (__len2 != 0) goto LAB_002f8bae;
        goto LAB_002f8c34;
      }
      if (__len2 == 0) goto LAB_002f8c34;
LAB_002f8cbf:
      if (local_e8._16_4_ != -0x396fe) {
        if ((__len2 == 8) && (*__s == 0x6574617265646566)) {
          fed = getFederateAt(this,(LocalFederateId)0x0);
        }
        else {
LAB_002f8ce5:
          fed = getFederate(this,target);
        }
        if ((fed != (FederateState *)0x0) &&
           (local_e8._16_4_ = (fed->global_id)._M_i.gid, mode != HELICS_SEQUENCING_MODE_ORDERED)) {
          federateQuery_abi_cxx11_((string *)&local_168,this,fed,queryStr,false);
          iVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_168,"#wait");
          if (iVar5 == 0) {
            local_140 = &this->activeQueries;
            gmlc::concurrency::
            DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_118,(int)local_140);
            FederateState::addAction(fed,(ActionMessage *)local_e8);
            do {
              local_108._0_8_ = (_Base_ptr)0x32;
              if ((_State_baseV2 *)local_118._0_8_ == (_State_baseV2 *)0x0) {
                std::__throw_future_error(3);
              }
              fVar6 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000l>>
                                ((_State_baseV2 *)local_118._0_8_,
                                 (duration<long,_std::ratio<1L,_1000L>_> *)local_108);
              if (fVar6 != timeout) {
                if ((fVar6 == ready) || (fVar6 == deferred)) {
                  std::
                  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::get(__return_storage_ptr__,
                        (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_118);
                  gmlc::concurrency::
                  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::finishedWithValue(local_140,iVar4);
                }
                else {
                  local_108._0_8_ = (_Base_ptr)(local_108 + 0x10);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_108,"Unexpected Error #13","");
                  generateJsonErrorResponse
                            (__return_storage_ptr__,INTERNAL_ERROR,(string *)local_108);
                  if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)(local_108 + 0x10)) {
                    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                  }
                }
                goto LAB_002f9086;
              }
              federateQuery_abi_cxx11_(&local_138,this,fed,queryStr,false);
              query_abi_cxx11_();
            } while ((extraout_RAX & 1) != 0);
            gmlc::concurrency::
            DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::finishedWithValue(local_140,iVar4);
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_unused._0_8_ == &local_158) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   local_158._M_allocated_capacity;
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_158._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_168._M_unused._0_8_;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   local_158._M_allocated_capacity;
            }
            __return_storage_ptr__->_M_string_length = local_168._8_8_;
            local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_158._M_allocated_capacity = local_158._M_allocated_capacity & 0xffffffffffffff00;
            local_168._M_unused._M_object = &local_158;
LAB_002f9086:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_unused._0_8_ != &local_158) {
              operator_delete(local_168._M_unused._M_object,
                              (ulong)(local_158._M_allocated_capacity + 1));
            }
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_unused._0_8_ == &local_158) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   local_158._M_allocated_capacity;
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_158._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_168._M_unused._0_8_;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   local_158._M_allocated_capacity;
            }
            __return_storage_ptr__->_M_string_length = local_168._8_8_;
          }
          goto LAB_002f8d6a;
        }
      }
    }
LAB_002f8d13:
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_168,(int)&this->activeQueries);
    BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e8);
    std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    get(__return_storage_ptr__,
        (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_168);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::finishedWithValue(&this->activeQueries,iVar4);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
LAB_002f8d6a:
    ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    return __return_storage_ptr__;
  }
  if (__len2 == 4) {
    if ((int)*__s != 0x65726f63) {
      if ((this->super_BrokerBase).identifier._M_string_length != 4) goto LAB_002f8e57;
LAB_002f8b08:
      iVar4 = bcmp(__s,(this->super_BrokerBase).identifier._M_dataplus._M_p,__len2);
      if (iVar4 != 0) goto LAB_002f8e57;
    }
  }
  else if ((this->super_BrokerBase).identifier._M_string_length == __len2) {
    if (__len2 != 0) goto LAB_002f8b08;
  }
  else if (__len2 != 0) goto LAB_002f8e57;
  quickCoreQueries_abi_cxx11_((string *)local_e8,this,queryStr);
  if (local_e8._8_8_ == 0) {
    bVar3 = true;
    if ((size == 4) && (*(undefined4 *)__src == 0x73676f6c)) {
      local_138._M_dataplus._M_p._0_1_ = 0;
      local_138._M_string_length = 0;
      local_158._M_allocated_capacity = 0;
      local_158._8_8_ = 0;
      local_168._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      loadBasicJsonInfo(this,(json *)&local_138,
                        (function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&,_const_helics::FedInfo_&)>
                         *)&local_168);
      if ((code *)local_158._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_158._M_allocated_capacity)(&local_168,&local_168,3);
      }
      bufferToJson(&((this->super_BrokerBase).mLogManager.
                     super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    mLogBuffer,(json *)&local_138);
      fileops::generateJsonString(__return_storage_ptr__,(json *)&local_138,true);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_138);
      goto LAB_002f8e30;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((undefined1 *)local_e8._0_8_ == local_e8 + 0x10) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT44(local_e8._20_4_,local_e8._16_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_e8._24_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e8._0_8_;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT44(local_e8._20_4_,local_e8._16_4_);
    }
    __return_storage_ptr__->_M_string_length = local_e8._8_8_;
    local_e8._8_8_ = 0;
    local_e8._16_4_ = local_e8._16_4_ & 0xffffff00;
    local_e8._0_8_ = local_e8 + 0x10;
LAB_002f8e30:
    bVar3 = false;
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
  }
  if (!bVar3) {
    return __return_storage_ptr__;
  }
LAB_002f8e57:
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Core has terminated","");
  generateJsonErrorResponse(__return_storage_ptr__,DISCONNECTED,(string *)local_e8);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,CONCAT44(local_e8._20_4_,local_e8._16_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommonCore::query(std::string_view target,
                              std::string_view queryStr,
                              HelicsSequencingModes mode)
{
    if (getBrokerState() >= BrokerState::TERMINATING) {
        if (target == "core" || target == getIdentifier() || target.empty()) {
            auto res = quickCoreQueries(queryStr);
            if (!res.empty()) {
                return res;
            }
            if (queryStr == "logs") {
                nlohmann::json base;
                loadBasicJsonInfo(base, nullptr);
                bufferToJson(mLogManager->getLogBuffer(), base);
                return fileops::generateJsonString(base);
            }
        }
        return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Core has terminated");
    }
    ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_QUERY : CMD_QUERY_ORDERED);
    querycmd.source_id = gDirectCoreId;
    querycmd.dest_id = parent_broker_id;
    querycmd.payload = queryStr;
    auto index = ++queryCounter;
    querycmd.messageID = index;
    querycmd.setStringData(target);

    if (target == "core" || target == getIdentifier() || target.empty()) {
        auto res = quickCoreQueries(queryStr);
        if (!res.empty()) {
            return res;
        }
        if (queryStr == "address") {
            res = generateJsonQuotedString(getAddress());
            return res;
        }
        querycmd.setAction(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                 CMD_BROKER_QUERY_ORDERED);
        querycmd.dest_id = gDirectCoreId;
    }
    if (querycmd.dest_id != gDirectCoreId) {
        // default into a federate query
        auto* fed =
            (target != "federate") ? getFederate(target) : getFederateAt(LocalFederateId(0));
        if (fed != nullptr) {
            querycmd.dest_id = fed->global_id;
            if (mode != HELICS_SEQUENCING_MODE_ORDERED) {
                std::string ret = federateQuery(fed, queryStr, false);
                if (ret != "#wait") {
                    return ret;
                }

                auto queryResult = activeQueries.getFuture(querycmd.messageID);
                fed->addAction(std::move(querycmd));
                std::future_status status = std::future_status::timeout;
                while (status == std::future_status::timeout) {
                    status = queryResult.wait_for(std::chrono::milliseconds(50));
                    switch (status) {
                        case std::future_status::ready:
                        case std::future_status::deferred: {
                            auto qres = queryResult.get();
                            activeQueries.finishedWithValue(index);
                            return qres;
                        }
                        case std::future_status::timeout: {  // federate query may need to wait or
                                                             // can get the result now
                            ret = federateQuery(fed,
                                                queryStr,
                                                mode == HELICS_SEQUENCING_MODE_ORDERED);
                            if (ret != "#wait") {
                                activeQueries.finishedWithValue(index);
                                return ret;
                            }
                        } break;
                        default:
                            status = std::future_status::ready;  // LCOV_EXCL_LINE
                    }
                }
                return generateJsonErrorResponse(JsonErrorCodes::INTERNAL_ERROR,
                                                 "Unexpected Error #13");  // LCOV_EXCL_LINE
            }
        }
    }

    auto queryResult = activeQueries.getFuture(querycmd.messageID);
    addActionMessage(std::move(querycmd));
    auto ret = queryResult.get();
    activeQueries.finishedWithValue(index);
    return ret;
}